

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffimport_file(char *filename,char **contents,int *status)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  FILE *aFile;
  char line [256];
  char *lines;
  int eoline;
  int llen;
  int totalLen;
  int allocLen;
  char local_138 [256];
  undefined1 *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  undefined8 *local_18;
  char *local_10;
  int local_4;
  
  local_30 = 1;
  if (*in_RDX < 1) {
    local_28 = 0;
    local_24 = 0x400;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_38 = (undefined1 *)malloc(0x400);
    if (local_38 == (undefined1 *)0x0) {
      ffpmsg((char *)0x11ed53);
      *local_20 = 0x71;
      local_4 = 0x71;
    }
    else {
      *local_38 = 0;
      __stream = fopen64(local_10,"r");
      if (__stream == (FILE *)0x0) {
        snprintf(local_138,0x100,"Could not open ASCII file %s.",local_10);
        ffpmsg((char *)0x11edc5);
        free(local_38);
        *local_20 = 0x68;
        local_4 = 0x68;
      }
      else {
        while (pcVar2 = fgets(local_138,0x100,__stream), pcVar2 != (char *)0x0) {
          sVar3 = strlen(local_138);
          iVar1 = (int)sVar3;
          local_2c = iVar1;
          if ((((local_30 == 0) || (iVar1 < 2)) || (local_138[0] != '/')) || (local_138[1] != '/'))
          {
            local_30 = 0;
            if ((0 < iVar1) && ((local_138[iVar1 + -1] == '\n' || (local_138[iVar1 + -1] == '\r'))))
            {
              local_2c = iVar1 + -1;
              local_138[iVar1 + -1] = '\0';
              local_30 = 1;
              if ((0 < local_2c) &&
                 ((local_138[local_2c + -1] == '\n' || (local_138[local_2c + -1] == '\r')))) {
                local_2c = local_2c + -1;
                local_138[local_2c] = '\0';
              }
            }
            if (local_24 <= local_28 + local_2c + 3) {
              local_24 = local_24 + 0x100;
              local_38 = (undefined1 *)realloc(local_38,(long)local_24);
              if (local_38 == (undefined1 *)0x0) {
                ffpmsg((char *)0x11ef68);
                *local_20 = 0x71;
                break;
              }
            }
            strcpy(local_38 + local_28,local_138);
            local_28 = local_2c + local_28;
            if (local_30 != 0) {
              strcpy(local_38 + local_28," ");
              local_28 = local_28 + 1;
            }
          }
        }
        fclose(__stream);
        *local_18 = local_38;
        local_4 = *local_20;
      }
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffimport_file( char *filename,   /* Text file to read                   */
                   char **contents,  /* Pointer to pointer to hold file     */
                   int *status )     /* CFITSIO error code                  */
/*
   Read and concatenate all the lines from the given text file.  User
   must free the pointer returned in contents.  Pointer is guaranteed
   to hold 2 characters more than the length of the text... allows the
   calling routine to append (or prepend) a newline (or quotes?) without
   reallocating memory.
*/
{
   int allocLen, totalLen, llen, eoline = 1;
   char *lines,line[256];
   FILE *aFile;

   if( *status > 0 ) return( *status );

   totalLen =    0;
   allocLen = 1024;
   lines    = (char *)malloc( allocLen * sizeof(char) );
   if( !lines ) {
      ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   lines[0] = '\0';

   if( (aFile = fopen( filename, "r" ))==NULL ) {
      snprintf(line,256,"Could not open ASCII file %s.",filename);
      ffpmsg(line);
      free( lines );
      return(*status = FILE_NOT_OPENED);
   }

   while( fgets(line,256,aFile)!=NULL ) {
      llen = strlen(line);
      if ( eoline && (llen > 1) && (line[0] == '/' && line[1] == '/'))
          continue;       /* skip comment lines begging with // */

      eoline = 0;

      /* replace CR and newline chars at end of line with nulls */
      if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
          line[--llen] = '\0';
          eoline = 1;   /* found an end of line character */

          if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
                 line[--llen] = '\0';
          }
      }

      if( totalLen + llen + 3 >= allocLen ) {
         allocLen += 256;
         lines = (char *)realloc(lines, allocLen * sizeof(char) );
         if( ! lines ) {
            ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
            *status = MEMORY_ALLOCATION;
            break;
         }
      }
      strcpy( lines+totalLen, line );
      totalLen += llen;

      if (eoline) {
         strcpy( lines+totalLen, " "); /* add a space between lines */
         totalLen += 1;
      }
   }
   fclose(aFile);

   *contents = lines;
   return( *status );
}